

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpcollisionlist.h
# Opt level: O3

void __thiscall jrtplib::RTPCollisionList::~RTPCollisionList(RTPCollisionList *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPCollisionList_00142fa0;
  Clear(this);
  p_Var2 = (this->addresslist).
           super__List_base<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->addresslist) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x20);
    p_Var2 = p_Var1;
  }
  return;
}

Assistant:

~RTPCollisionList()								{ Clear(); }